

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alltests.cpp
# Opt level: O0

string * testFile(string *__return_storage_ptr__,string *fn)

{
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *fn_local;
  
  local_18 = fn;
  fn_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"tests/data/",&local_39);
  std::operator+(__return_storage_ptr__,&local_38,fn);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string testFile(std::string fn) { return std::string("tests/data/") + fn; }